

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O2

void uv__wait_children(uv_loop_t *loop)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  void **ppvVar4;
  __pid_t _Var5;
  int *piVar6;
  uint uVar7;
  long *plVar8;
  void **ppvVar9;
  int status;
  QUEUE pending;
  
  plVar2 = (long *)loop->process_handles[0];
  pending[0] = pending;
  pending[1] = pending;
LAB_0055217b:
  do {
    plVar8 = plVar2;
    ppvVar4 = (void **)pending[0];
    if ((void **)plVar8 == loop->process_handles) {
      while (ppvVar9 = ppvVar4, ppvVar9 != pending) {
        ppvVar4 = (void **)*ppvVar9;
        *(void ***)ppvVar9[1] = ppvVar4;
        ppvVar4[1] = ppvVar9[1];
        *ppvVar9 = ppvVar9;
        ppvVar9[1] = ppvVar9;
        uVar1 = *(uint *)(ppvVar9 + -3);
        if (((uVar1 & 4) != 0) && (*(uint *)(ppvVar9 + -3) = uVar1 & 0xfffffffb, (uVar1 & 8) != 0))
        {
          *(int *)((long)ppvVar9[-0xd] + 8) = *(int *)((long)ppvVar9[-0xd] + 8) + -1;
        }
        if ((code *)ppvVar9[-2] != (code *)0x0) {
          uVar7 = *(uint *)(ppvVar9 + 2) & 0x7f;
          uVar1 = *(uint *)(ppvVar9 + 2) >> 8 & 0xff;
          if (uVar7 != 0) {
            uVar1 = 0;
          }
          if ((int)(uVar7 * 0x1000000 + 0x1000000) < 0x2000000) {
            uVar7 = 0;
          }
          (*(code *)ppvVar9[-2])(ppvVar9 + -0xe,uVar1,uVar7);
        }
      }
      if (pending != (void **)pending[0]) {
        __assert_fail("QUEUE_EMPTY(&pending)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                      ,0xa9,"void uv__wait_children(uv_loop_t *)");
      }
      return;
    }
    plVar2 = (long *)*plVar8;
    do {
      _Var5 = waitpid((__pid_t)plVar8[-1],&status,1);
      if (_Var5 != -1) {
        if (_Var5 != 0) {
          if (_Var5 != (int)plVar8[-1]) {
            __assert_fail("pid == process->pid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                          ,0x8c,"void uv__wait_children(uv_loop_t *)");
          }
          *(int *)(plVar8 + 2) = status;
          lVar3 = *plVar8;
          *(long *)plVar8[1] = lVar3;
          *(long *)(lVar3 + 8) = plVar8[1];
          *plVar8 = (long)pending;
          plVar8[1] = (long)pending[1];
          *(long **)pending[1] = plVar8;
          pending[1] = plVar8;
        }
        goto LAB_0055217b;
      }
      piVar6 = __errno_location();
    } while (*piVar6 == 4);
    if (*piVar6 != 10) {
      abort();
    }
  } while( true );
}

Assistant:

void uv__wait_children(uv_loop_t* loop) {
  uv_process_t* process;
  int exit_status;
  int term_signal;
  int status;
  int options;
  pid_t pid;
  QUEUE pending;
  QUEUE* q;
  QUEUE* h;

  QUEUE_INIT(&pending);

  h = &loop->process_handles;
  q = QUEUE_HEAD(h);
  while (q != h) {
    process = QUEUE_DATA(q, uv_process_t, queue);
    q = QUEUE_NEXT(q);

#ifndef UV_USE_SIGCHLD
    if ((process->flags & UV_HANDLE_REAP) == 0)
      continue;
    options = 0;
    process->flags &= ~UV_HANDLE_REAP;
#else
    options = WNOHANG;
#endif

    do
      pid = waitpid(process->pid, &status, options);
    while (pid == -1 && errno == EINTR);

#ifdef UV_USE_SIGCHLD
    if (pid == 0) /* Not yet exited */
      continue;
#endif

    if (pid == -1) {
      if (errno != ECHILD)
        abort();
      /* The child died, and we missed it. This probably means someone else
       * stole the waitpid from us. Handle this by not handling it at all. */
      continue;
    }

    assert(pid == process->pid);
    process->status = status;
    QUEUE_REMOVE(&process->queue);
    QUEUE_INSERT_TAIL(&pending, &process->queue);
  }

  h = &pending;
  q = QUEUE_HEAD(h);
  while (q != h) {
    process = QUEUE_DATA(q, uv_process_t, queue);
    q = QUEUE_NEXT(q);

    QUEUE_REMOVE(&process->queue);
    QUEUE_INIT(&process->queue);
    uv__handle_stop(process);

    if (process->exit_cb == NULL)
      continue;

    exit_status = 0;
    if (WIFEXITED(process->status))
      exit_status = WEXITSTATUS(process->status);

    term_signal = 0;
    if (WIFSIGNALED(process->status))
      term_signal = WTERMSIG(process->status);

    process->exit_cb(process, exit_status, term_signal);
  }
  assert(QUEUE_EMPTY(&pending));
}